

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O1

void __thiscall data_structures::LinkedList<char>::~LinkedList(LinkedList<char> *this)

{
  ListNode<char> *pLVar1;
  ListNode<char> *pLVar2;
  ListNode<char> *temp_node;
  
  this->_vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010dd58;
  pLVar2 = this->_header;
  if (pLVar2 != this->_tail) {
    do {
      pLVar1 = pLVar2->_next;
      if (pLVar1 != (ListNode<char> *)0x0) {
        pLVar2->_next = pLVar1->_next;
        (*pLVar1->_vptr_ListNode[1])(pLVar1);
      }
      if (pLVar1 == this->_tail) {
        this->_tail = pLVar2;
      }
      this->_size = this->_size - 1;
      pLVar2 = this->_header;
    } while (pLVar2 != this->_tail);
  }
  if (pLVar2 != (ListNode<char> *)0x0) {
    (*pLVar2->_vptr_ListNode[1])(pLVar2);
  }
  this->_header = (ListNode<char> *)0x0;
  this->_tail = (ListNode<char> *)0x0;
  this->_size = 0;
  operator_delete(this,0x20);
  return;
}

Assistant:

inline
    LinkedList<T>::~LinkedList(){
        while (!isEmpty()) {
            deleteFromHeader();
        }
        delete _header;
        _header = 0;
        _tail = 0;
        _size = 0;
    }